

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticitiesAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::readValueFrom
          (TypedAttribute<Imf_3_2::Chromaticities> *this,IStream *is,int size,int version)

{
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,(float *)&this->_value);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,&(this->_value).red.y);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,&(this->_value).green.x);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,&(this->_value).green.y);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,&(this->_value).blue.x);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,&(this->_value).blue.y);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,&(this->_value).white.x);
  Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,&(this->_value).white.y);
  return;
}

Assistant:

IMF_EXPORT void
ChromaticitiesAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value.red.x);
    Xdr::read<StreamIO> (is, _value.red.y);
    Xdr::read<StreamIO> (is, _value.green.x);
    Xdr::read<StreamIO> (is, _value.green.y);
    Xdr::read<StreamIO> (is, _value.blue.x);
    Xdr::read<StreamIO> (is, _value.blue.y);
    Xdr::read<StreamIO> (is, _value.white.x);
    Xdr::read<StreamIO> (is, _value.white.y);
}